

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

ATMPArgs *
anon_unknown.dwarf_2401980::MemPoolAccept::ATMPArgs::PackageTestAccept
          (CChainParams *chainparams,int64_t accept_time,
          vector<COutPoint,_std::allocator<COutPoint>_> *coins_to_uncache)

{
  optional<CFeeRate> client_maxfeerate;
  ATMPArgs *in_RDI;
  long in_FS_OFFSET;
  undefined2 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  undefined1 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  uint in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff7f;
  uint in_stack_ffffffffffffff84;
  undefined8 local_18;
  _Storage<CFeeRate,_true> in_stack_fffffffffffffff0;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<CFeeRate>::optional
            ((optional<CFeeRate> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   in_stack_ffffffffffffff68)))))));
  client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = lVar1;
  client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = in_stack_fffffffffffffff0;
  ATMPArgs((ATMPArgs *)in_stack_fffffffffffffff0,local_18,(ulong)in_stack_ffffffffffffff84 << 0x20,
           (bool)in_stack_ffffffffffffff7f,
           (vector<COutPoint,_std::allocator<COutPoint>_> *)
           ((ulong)in_stack_ffffffffffffff74 << 0x20),(bool)in_stack_ffffffffffffff6f,
           (bool)in_stack_ffffffffffffff6e,(bool)in_stack_ffffffffffffff6d,
           (bool)in_stack_ffffffffffffff6c,false,client_maxfeerate,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static ATMPArgs PackageTestAccept(const CChainParams& chainparams, int64_t accept_time,
                                          std::vector<COutPoint>& coins_to_uncache) {
            return ATMPArgs{/* m_chainparams */ chainparams,
                            /* m_accept_time */ accept_time,
                            /* m_bypass_limits */ false,
                            /* m_coins_to_uncache */ coins_to_uncache,
                            /* m_test_accept */ true,
                            /* m_allow_replacement */ false,
                            /* m_allow_sibling_eviction */ false,
                            /* m_package_submission */ false, // not submitting to mempool
                            /* m_package_feerates */ false,
                            /* m_client_maxfeerate */ {}, // checked by caller
                            /* m_allow_carveouts */ false,
            };
        }